

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gennorm2.cpp
# Opt level: O3

void icu_63::parseFile(ifstream *f,Normalizer2DataBuilder *builder)

{
  UErrorCode *pErrorCode;
  byte bVar1;
  bool bVar2;
  icu_63 *this;
  char cVar3;
  int iVar4;
  int32_t iVar5;
  int32_t textLength;
  UErrorCode __status;
  istream *piVar6;
  char *pcVar7;
  _func_int **__nptr;
  ulong uVar8;
  undefined8 extraout_RAX;
  uint uVar9;
  uint32_t endCP;
  uint32_t startCP;
  char *delimiter;
  IcuToolErrorCode errorCode;
  string lineString;
  char *end;
  UChar uchars [31];
  uint local_118;
  uint local_114;
  ConstChar16Ptr local_110;
  byte *local_108;
  IcuToolErrorCode local_100;
  icu_63 *local_e8;
  long local_e0;
  icu_63 local_d8 [16];
  UChar *local_c8;
  UnicodeString local_b8;
  UChar local_78 [36];
  
  pErrorCode = &local_100.super_ErrorCode.errorCode;
  local_100.super_ErrorCode.errorCode = U_ZERO_ERROR;
  local_100.super_ErrorCode._vptr_ErrorCode = (_func_int **)&PTR__IcuToolErrorCode_003abfa8;
  local_100.location = "gennorm2/parseFile()";
  local_e8 = local_d8;
  local_e0 = 0;
  local_d8[0] = (icu_63)0x0;
  do {
    while( true ) {
      do {
        do {
          cVar3 = std::ios::widen((char)*(undefined8 *)(*(long *)f + -0x18) + (char)f);
          piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)f,(string *)&local_e8,cVar3);
          this = local_e8;
          if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
            if (local_e8 != local_d8) {
              operator_delete(local_e8);
            }
            IcuToolErrorCode::~IcuToolErrorCode(&local_100);
            return;
          }
        } while (local_e0 == 0);
        pcVar7 = strchr((char *)local_e8,0x23);
        if (pcVar7 != (char *)0x0) {
          *pcVar7 = '\0';
        }
        u_rtrim((char *)this);
      } while (*this == (icu_63)0x0);
      if (*this != (icu_63)0x2a) break;
      pcVar7 = u_skipWhitespace((char *)(this + 1));
      iVar4 = strncmp(pcVar7,"Unicode",7);
      if (iVar4 == 0) {
        pcVar7 = u_skipWhitespace(pcVar7 + 7);
        Normalizer2DataBuilder::setUnicodeVersion(builder,pcVar7);
      }
    }
    iVar5 = u_parseCodePointRangeAnyTerminator
                      ((char *)this,&local_114,&local_118,(char **)&local_108,pErrorCode);
    if (U_ZERO_ERROR < local_100.super_ErrorCode.errorCode) {
      fprintf(_stderr,"gennorm2 error: parsing code point range from %s\n",this);
      __status = ErrorCode::reset(&local_100.super_ErrorCode);
LAB_001dc7ef:
      exit(__status);
    }
    if ((0xd7ff < local_118) && (local_114 < 0xe000)) {
      parseFile(this);
LAB_001dc7fe:
      parseFile(this);
LAB_001dc806:
      parseFile(this);
LAB_001dc80e:
      parseFile(this);
LAB_001dc816:
      parseFile(this);
      UnicodeString::~UnicodeString(&local_b8);
      if (local_e8 != local_d8) {
        operator_delete(local_e8);
      }
      IcuToolErrorCode::~IcuToolErrorCode(&local_100);
      _Unwind_Resume(extraout_RAX);
    }
    local_108 = (byte *)u_skipWhitespace((char *)local_108);
    bVar1 = *local_108;
    if (bVar1 - 0x3d < 2) {
      textLength = u_parseString((char *)(local_108 + 1),local_78,0x1f,(uint32_t *)0x0,pErrorCode);
      if (U_ZERO_ERROR < local_100.super_ErrorCode.errorCode) {
        fprintf(_stderr,"gennorm2 error: parsing mapping string from %s\n",this);
        __status = ErrorCode::reset(&local_100.super_ErrorCode);
        goto LAB_001dc7ef;
      }
      local_110.p_ = local_78;
      UnicodeString::UnicodeString(&local_b8,'\0',&local_110,textLength);
      local_c8 = local_110.p_;
      if (*local_108 == 0x3d) {
        if (iVar5 != 1) goto LAB_001dc816;
        Normalizer2DataBuilder::setRoundTripMapping(builder,local_114,&local_b8);
      }
      else {
        uVar9 = local_114;
        if ((int)local_114 <= (int)local_118) {
          do {
            Normalizer2DataBuilder::setOneWayMapping(builder,uVar9,&local_b8);
            bVar2 = (int)uVar9 < (int)local_118;
            uVar9 = uVar9 + 1;
          } while (bVar2);
        }
      }
      UnicodeString::~UnicodeString(&local_b8);
    }
    else if (bVar1 == 0x2d) {
      pcVar7 = u_skipWhitespace((char *)(local_108 + 1));
      if (*pcVar7 != '\0') goto LAB_001dc80e;
      uVar9 = local_114;
      if ((int)local_114 <= (int)local_118) {
        do {
          Normalizer2DataBuilder::removeMapping(builder,uVar9);
          bVar2 = (int)uVar9 < (int)local_118;
          uVar9 = uVar9 + 1;
        } while (bVar2);
      }
    }
    else {
      if (bVar1 != 0x3a) goto LAB_001dc806;
      __nptr = (_func_int **)u_skipWhitespace((char *)(local_108 + 1));
      uVar8 = strtoul((char *)__nptr,(char **)&local_b8,10);
      if ((((ulong)local_b8.super_Replaceable.super_UObject._vptr_UObject <= __nptr) ||
          (pcVar7 = u_skipWhitespace((char *)local_b8.super_Replaceable.super_UObject._vptr_UObject)
          , *pcVar7 != '\0')) || (0xfe < uVar8)) goto LAB_001dc7fe;
      uVar9 = local_114;
      if ((int)local_114 <= (int)local_118) {
        do {
          Normalizer2DataBuilder::setCC(builder,uVar9,(uint8_t)uVar8);
          bVar2 = (int)uVar9 < (int)local_118;
          uVar9 = uVar9 + 1;
        } while (bVar2);
      }
    }
  } while( true );
}

Assistant:

void parseFile(std::ifstream &f, Normalizer2DataBuilder &builder) {
    IcuToolErrorCode errorCode("gennorm2/parseFile()");
    std::string lineString;
    uint32_t startCP, endCP;
    while(std::getline(f, lineString)) {
        if (lineString.empty()) {
            continue;  // skip empty lines.
        }
#if (U_CPLUSPLUS_VERSION >= 11)
        char *line = &lineString.front();
#else
        char *line = &lineString.at(0);
#endif
        char *comment=(char *)strchr(line, '#');
        if(comment!=NULL) {
            *comment=0;
        }
        u_rtrim(line);
        if(line[0]==0) {
            continue;  // skip empty and comment-only lines
        }
        if(line[0]=='*') {
            const char *s=u_skipWhitespace(line+1);
            if(0==strncmp(s, "Unicode", 7)) {
                s=u_skipWhitespace(s+7);
                builder.setUnicodeVersion(s);
            }
            continue;  // reserved syntax
        }
        const char *delimiter;
        int32_t rangeLength=
            u_parseCodePointRangeAnyTerminator(line, &startCP, &endCP, &delimiter, errorCode);
        if(errorCode.isFailure()) {
            fprintf(stderr, "gennorm2 error: parsing code point range from %s\n", line);
            exit(errorCode.reset());
        }
        if (endCP >= 0xd800 && startCP <= 0xdfff) {
                fprintf(stderr, "gennorm2 error: value or mapping for surrogate code points: %s\n",
                        line);
                exit(U_ILLEGAL_ARGUMENT_ERROR);
        }
        delimiter=u_skipWhitespace(delimiter);
        if(*delimiter==':') {
            const char *s=u_skipWhitespace(delimiter+1);
            char *end;
            unsigned long value=strtoul(s, &end, 10);
            if(end<=s || *u_skipWhitespace(end)!=0 || value>=0xff) {
                fprintf(stderr, "gennorm2 error: parsing ccc from %s\n", line);
                exit(U_PARSE_ERROR);
            }
            for(UChar32 c=(UChar32)startCP; c<=(UChar32)endCP; ++c) {
                builder.setCC(c, (uint8_t)value);
            }
            continue;
        }
        if(*delimiter=='-') {
            if(*u_skipWhitespace(delimiter+1)!=0) {
                fprintf(stderr, "gennorm2 error: parsing remove-mapping %s\n", line);
                exit(U_PARSE_ERROR);
            }
            for(UChar32 c=(UChar32)startCP; c<=(UChar32)endCP; ++c) {
                builder.removeMapping(c);
            }
            continue;
        }
        if(*delimiter=='=' || *delimiter=='>') {
            UChar uchars[Normalizer2Impl::MAPPING_LENGTH_MASK];
            int32_t length=u_parseString(delimiter+1, uchars, UPRV_LENGTHOF(uchars), NULL, errorCode);
            if(errorCode.isFailure()) {
                fprintf(stderr, "gennorm2 error: parsing mapping string from %s\n", line);
                exit(errorCode.reset());
            }
            UnicodeString mapping(FALSE, uchars, length);
            if(*delimiter=='=') {
                if(rangeLength!=1) {
                    fprintf(stderr,
                            "gennorm2 error: round-trip mapping for more than 1 code point on %s\n",
                            line);
                    exit(U_PARSE_ERROR);
                }
                builder.setRoundTripMapping((UChar32)startCP, mapping);
            } else {
                for(UChar32 c=(UChar32)startCP; c<=(UChar32)endCP; ++c) {
                    builder.setOneWayMapping(c, mapping);
                }
            }
            continue;
        }
        fprintf(stderr, "gennorm2 error: unrecognized data line %s\n", line);
        exit(U_PARSE_ERROR);
    }
}